

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor.hpp
# Opt level: O0

ostream * operator<<(ostream *stream,taylor<double,_2,_12> *t)

{
  ostream *poVar1;
  double *pdVar2;
  int local_1c;
  int i;
  taylor<double,_2,_12> *t_local;
  ostream *stream_local;
  
  poVar1 = std::operator<<(stream,"{");
  pdVar2 = taylor<double,_2,_12>::operator[](t,0);
  std::ostream::operator<<(poVar1,*pdVar2);
  for (local_1c = 1; local_1c < 0x5b; local_1c = local_1c + 1) {
    poVar1 = std::operator<<(stream,", ");
    pdVar2 = taylor<double,_2,_12>::operator[](t,local_1c);
    std::ostream::operator<<(poVar1,*pdVar2);
  }
  std::operator<<(stream,"}");
  return stream;
}

Assistant:

static std::ostream & operator<<(std::ostream & stream,
                                 const taylor<num, Nvar, Ndeg> & t) {
  stream << "{" << t[0];
  for (int i = 1; i < t.size; i++)
    stream << ", " << t[i];
  stream << "}";
  return stream;
}